

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O3

void __thiscall
QCompletionEngine::saveInCache
          (QCompletionEngine *this,QString part,QModelIndex *parent,QMatchData *m)

{
  Cache *this_00;
  long lVar1;
  undefined8 uVar2;
  QArrayData *pQVar3;
  quintptr qVar4;
  QAbstractItemModel *pQVar5;
  bool bVar6;
  int iVar7;
  QMap<QString,_QMatchData> *pQVar8;
  const_iterator alast;
  iterator afirst;
  QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
  *pQVar9;
  const_iterator afirst_00;
  const_iterator alast_00;
  QMatchData *pQVar10;
  undefined1 *in_RCX;
  int iVar11;
  long in_FS_OFFSET;
  QMatchData old;
  QArrayData *local_88;
  quintptr qStack_80;
  QAbstractItemModel *local_78;
  undefined1 *local_68;
  QArrayData *pQStack_60;
  int *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->c->filterMode).super_QFlagsStorageHelper<Qt::MatchFlag,_4>.
      super_QFlagsStorage<Qt::MatchFlag>.i != 3) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (int *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = &this->cache;
    pQVar8 = QMap<QModelIndex,_QMap<QString,_QMatchData>_>::operator[](this_00,(QModelIndex *)m);
    QMap<QString,_QMatchData>::take((QMatchData *)&local_68,pQVar8,(QString *)parent);
    iVar7 = (this->cost + *(int *)(in_RCX + 0x18)) - (int)puStack_50;
    this->cost = iVar7;
    if (0x100000 < (ulong)((long)iVar7 << 2)) {
      QMap<QModelIndex,_QMap<QString,_QMatchData>_>::detach(this_00);
      afirst_00._M_node =
           *(_Base_ptr *)
            ((long)&(((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
      QMap<QModelIndex,_QMap<QString,_QMatchData>_>::detach(this_00);
      if ((_Rb_tree_header *)afirst_00._M_node !=
          &(((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
        do {
          if (*(long *)((long)afirst_00._M_node + 0x38) == 0) {
            iVar7 = 0;
          }
          else {
            lVar1 = *(long *)(*(long *)((long)afirst_00._M_node + 0x38) + 0x30);
            iVar7 = (int)((ulong)(lVar1 - (lVar1 >> 0x3f)) >> 1);
          }
          pQVar8 = (QMap<QString,_QMatchData> *)((long)afirst_00._M_node + 0x38);
          QMap<QString,_QMatchData>::detach(pQVar8);
          afirst._M_node =
               *(_Base_ptr *)
                ((long)&(((pQVar8->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10
                );
          QMap<QString,_QMatchData>::detach(pQVar8);
          pQVar9 = (pQVar8->d).d.ptr;
          if (((_Rb_tree_header *)afirst._M_node != &(pQVar9->m)._M_t._M_impl.super__Rb_tree_header)
             && (0 < iVar7)) {
            iVar11 = 1;
            do {
              this->cost = (this->cost - *(int *)&afirst._M_node[2]._M_left) + -2;
              alast.i._M_node = (const_iterator)std::_Rb_tree_increment(afirst._M_node);
              afirst._M_node =
                   (_Base_ptr)QMap<QString,_QMatchData>::erase(pQVar8,afirst._M_node,alast);
              QMap<QString,_QMatchData>::detach(pQVar8);
              pQVar9 = (pQVar8->d).d.ptr;
              if ((_Rb_tree_header *)afirst._M_node ==
                  &(pQVar9->m)._M_t._M_impl.super__Rb_tree_header) break;
              bVar6 = iVar11 < iVar7;
              iVar11 = iVar11 + 1;
            } while (bVar6);
          }
          if ((pQVar9 == (QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
                          *)0x0) ||
             ((pQVar9->m)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
            alast_00.i._M_node = (const_iterator)std::_Rb_tree_increment(afirst_00._M_node);
            afirst_00._M_node =
                 (_Base_ptr)
                 QMap<QModelIndex,_QMap<QString,_QMatchData>_>::erase
                           (this_00,afirst_00._M_node,alast_00);
          }
          else {
            afirst_00._M_node = (_Base_ptr)std::_Rb_tree_increment(afirst_00._M_node);
          }
          QMap<QModelIndex,_QMap<QString,_QMatchData>_>::detach(this_00);
        } while ((_Rb_tree_header *)afirst_00._M_node !=
                 &(((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header);
      }
    }
    if (this->c->cs == CaseInsensitive) {
      QString::toLower_helper((QString *)&local_88);
      pQVar3 = *(QArrayData **)parent;
      qVar4 = parent->i;
      *(QArrayData **)parent = local_88;
      parent->i = qStack_80;
      pQVar5 = (parent->m).ptr;
      (parent->m).ptr = local_78;
      local_88 = pQVar3;
      qStack_80 = qVar4;
      local_78 = pQVar5;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,2,0x10);
        }
      }
    }
    pQVar8 = QMap<QModelIndex,_QMap<QString,_QMatchData>_>::operator[](this_00,(QModelIndex *)m);
    pQVar10 = QMap<QString,_QMatchData>::operator[](pQVar8,(QString *)parent);
    (pQVar10->indices).v = (bool)*in_RCX;
    QArrayDataPointer<int>::operator=
              (&(pQVar10->indices).vector.d,(QArrayDataPointer<int> *)(in_RCX + 8));
    uVar2 = *(undefined8 *)(in_RCX + 0x20);
    (pQVar10->indices).f = (int)uVar2;
    (pQVar10->indices).t = (int)((ulong)uVar2 >> 0x20);
    pQVar10->partial = (bool)in_RCX[0x2c];
    pQVar10->exactMatchIndex = *(int *)(in_RCX + 0x28);
    if (pQStack_60 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_60,4,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCompletionEngine::saveInCache(QString part, const QModelIndex& parent, const QMatchData& m)
{
    if (c->filterMode == Qt::MatchEndsWith)
        return;
    QMatchData old = cache[parent].take(part);
    cost = cost + m.indices.cost() - old.indices.cost();
    if (cost * sizeof(int) > 1024 * 1024) {
        QMap<QModelIndex, CacheItem>::iterator it1 = cache.begin();
        while (it1 != cache.end()) {
            CacheItem& ci = it1.value();
            int sz = ci.size()/2;
            QMap<QString, QMatchData>::iterator it2 = ci.begin();
            int i = 0;
            while (it2 != ci.end() && i < sz) {
                cost -= it2.value().indices.cost();
                it2 = ci.erase(it2);
                i++;
            }
            if (ci.size() == 0) {
              it1 = cache.erase(it1);
            } else {
              ++it1;
            }
        }
    }

    if (c->cs == Qt::CaseInsensitive)
        part = std::move(part).toLower();
    cache[parent][part] = m;
}